

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ShowDebugLogFlag(char *name,ImGuiDebugLogFlags flags)

{
  bool bVar1;
  uint in_ESI;
  char *in_RDI;
  float fVar2;
  float _y;
  ImVec2 IVar3;
  ImVec2 *unaff_retaddr;
  ImVec2 size;
  ImGuiContext *g;
  int *in_stack_ffffffffffffffc8;
  float local_28;
  ImVec2 local_20;
  ImGuiContext *pIVar4;
  undefined4 in_stack_fffffffffffffff0;
  
  pIVar4 = GImGui;
  fVar2 = ImGui::GetFrameHeight();
  fVar2 = fVar2 + (pIVar4->Style).ItemInnerSpacing.x;
  IVar3 = ImGui::CalcTextSize(in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                              SUB81((ulong)pIVar4 >> 0x38,0),SUB84(pIVar4,0));
  local_28 = IVar3.x;
  local_28 = fVar2 + local_28;
  _y = ImGui::GetFrameHeight();
  ImVec2::ImVec2(&local_20,local_28,_y);
  SameLineOrWrap(unaff_retaddr);
  bVar1 = ImGui::CheckboxFlags((char *)CONCAT44(local_28,fVar2),in_stack_ffffffffffffffc8,0);
  if (((bVar1) && (((pIVar4->IO).KeyShift & 1U) != 0)) && ((pIVar4->DebugLogFlags & in_ESI) != 0)) {
    pIVar4->DebugLogAutoDisableFrames = '\x02';
    pIVar4->DebugLogAutoDisableFlags = in_ESI | pIVar4->DebugLogAutoDisableFlags;
  }
  ImGui::SetItemTooltip
            ("Hold SHIFT when clicking to enable for 2 frames only (useful for spammy log entries)")
  ;
  return;
}

Assistant:

static void ShowDebugLogFlag(const char* name, ImGuiDebugLogFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImVec2 size(ImGui::GetFrameHeight() + g.Style.ItemInnerSpacing.x + ImGui::CalcTextSize(name).x, ImGui::GetFrameHeight());
    SameLineOrWrap(size); // FIXME-LAYOUT: To be done automatically once we rework ItemSize/ItemAdd into ItemLayout.
    if (ImGui::CheckboxFlags(name, &g.DebugLogFlags, flags) && g.IO.KeyShift && (g.DebugLogFlags & flags) != 0)
    {
        g.DebugLogAutoDisableFrames = 2;
        g.DebugLogAutoDisableFlags |= flags;
    }
    ImGui::SetItemTooltip("Hold SHIFT when clicking to enable for 2 frames only (useful for spammy log entries)");
}